

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O0

void duckdb::ValidityUncompressed::AlignedScan
               (data_ptr_t input,idx_t input_start,Vector *result,idx_t scan_count)

{
  unsigned_long uVar1;
  TemplatedValidityMask<unsigned_long> *this;
  long in_RCX;
  ulong in_RSI;
  long in_RDI;
  validity_t input_entry;
  idx_t i;
  idx_t entry_scan_count;
  idx_t start_offset;
  unsigned_long *result_data;
  validity_t *input_data;
  ValidityMask *result_mask;
  ulong local_50;
  unsigned_long *local_38;
  
  this = &FlatVector::Validity((Vector *)0xa1a2a2)->super_TemplatedValidityMask<unsigned_long>;
  local_38 = TemplatedValidityMask<unsigned_long>::GetData(this);
  for (local_50 = 0; local_50 < in_RCX + 0x3fU >> 6; local_50 = local_50 + 1) {
    uVar1 = *(unsigned_long *)(in_RDI + ((in_RSI >> 6) + local_50) * 8);
    if ((local_38 != (unsigned_long *)0x0) || (uVar1 != 0xffffffffffffffff)) {
      if (local_38 == (unsigned_long *)0x0) {
        TemplatedValidityMask<unsigned_long>::Initialize
                  ((TemplatedValidityMask<unsigned_long> *)0xa1a333);
        local_38 = TemplatedValidityMask<unsigned_long>::GetData(this);
      }
      local_38[local_50] = uVar1;
    }
  }
  return;
}

Assistant:

void ValidityUncompressed::AlignedScan(data_ptr_t input, idx_t input_start, Vector &result, idx_t scan_count) {
	D_ASSERT(input_start % ValidityMask::BITS_PER_VALUE == 0);

	// aligned scan: no need to do anything fancy
	// note: this is only an optimization which avoids having to do messy bitshifting in the common case
	// it is not required for correctness
	auto &result_mask = FlatVector::Validity(result);
	auto input_data = reinterpret_cast<validity_t *>(input);
	auto result_data = result_mask.GetData();
	idx_t start_offset = input_start / ValidityMask::BITS_PER_VALUE;
	idx_t entry_scan_count = (scan_count + ValidityMask::BITS_PER_VALUE - 1) / ValidityMask::BITS_PER_VALUE;
	for (idx_t i = 0; i < entry_scan_count; i++) {
		auto input_entry = input_data[start_offset + i];
		if (!result_data && input_entry == ValidityMask::ValidityBuffer::MAX_ENTRY) {
			continue;
		}
		if (!result_data) {
			result_mask.Initialize();
			result_data = result_mask.GetData();
		}
		result_data[i] = input_entry;
	}
}